

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O2

int Gia_ManMarkAutonomous_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pObj_00;
  uint uVar5;
  char *__assertion;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 != 0) {
    return *(uint *)pObj >> 0x1e & 1;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar4 = *(ulong *)pObj;
  if (((uint)uVar4 >> 0x1e & 1) != 0) {
    __assertion = "pObj->fMark0 == 0";
    uVar5 = 0x32;
LAB_005bb550:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                  ,uVar5,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (((uint)uVar4 & 0x9fffffff) == 0x9fffffff) {
    iVar1 = Gia_ObjCioId(pObj);
    uVar4 = *(ulong *)pObj;
    if (iVar1 < p->vCis->nSize - p->nRegs) goto LAB_005bb44c;
  }
  if ((~uVar4 & 0x1fffffff1fffffff) == 0) {
LAB_005bb44c:
    *(ulong *)pObj = uVar4 | 0x40000000;
    return 1;
  }
  uVar5 = (uint)uVar4;
  uVar4 = uVar4 & 0x1fffffff;
  if (-1 < (int)uVar5 || uVar4 == 0x1fffffff) {
    if ((uVar5 & 0x9fffffff) == 0x9fffffff) {
      iVar2 = Gia_ObjCioId(pObj);
      iVar1 = p->vCis->nSize;
      if (iVar2 < iVar1 - p->nRegs) {
        __assert_fail("Gia_ObjIsRo(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar2 = p->vCos->nSize;
      iVar3 = Gia_ObjCioId(pObj);
      pObj_00 = Gia_ManCo(p,(iVar2 - iVar1) + iVar3);
      goto LAB_005bb4d6;
    }
    if (((int)uVar5 < 0) || ((int)uVar4 == 0x1fffffff)) {
      __assertion = "Gia_ObjIsAnd(pObj)";
      uVar5 = 0x39;
      goto LAB_005bb550;
    }
    iVar1 = Gia_ManMarkAutonomous_rec(p,pObj + -uVar4);
    uVar4 = *(ulong *)pObj;
    if (iVar1 != 0) goto LAB_005bb44c;
    uVar4 = (ulong)((uint)(uVar4 >> 0x20) & 0x1fffffff);
  }
  pObj_00 = pObj + -uVar4;
LAB_005bb4d6:
  iVar1 = Gia_ManMarkAutonomous_rec(p,pObj_00);
  *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | (ulong)(uint)(iVar1 << 0x1e);
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks objects reachables from Const0 and PIs/

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManMarkAutonomous_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( pObj->fMark0 == 0 );
    if ( Gia_ObjIsPi(p, pObj) || Gia_ObjIsConst0(pObj) )
        return pObj->fMark0 = 1;
    if ( Gia_ObjIsCo(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjRoToRi(p, pObj) );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) ) )
        return pObj->fMark0 = 1;
    return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin1(pObj) );
}